

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O0

void __thiscall llvm::SmallPtrSetImplBase::shrink_and_clear(SmallPtrSetImplBase *this)

{
  bool bVar1;
  size_type Value;
  uint uVar2;
  void **ppvVar3;
  uint local_24;
  uint Size;
  SmallPtrSetImplBase *this_local;
  
  bVar1 = isSmall(this);
  if (bVar1) {
    __assert_fail("!isSmall() && \"Can\'t shrink a small set!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0x1a,"void llvm::SmallPtrSetImplBase::shrink_and_clear()");
  }
  free(this->CurArray);
  Value = size(this);
  if (Value < 0x11) {
    local_24 = 0x20;
  }
  else {
    uVar2 = Log2_32_Ceil(Value);
    local_24 = 1 << ((char)uVar2 + 1U & 0x1f);
  }
  this->CurArraySize = local_24;
  this->NumTombstones = 0;
  this->NumNonEmpty = 0;
  ppvVar3 = (void **)safe_malloc((ulong)this->CurArraySize << 3);
  this->CurArray = ppvVar3;
  memset(this->CurArray,0xff,(ulong)this->CurArraySize << 3);
  return;
}

Assistant:

void SmallPtrSetImplBase::shrink_and_clear() {
  assert(!isSmall() && "Can't shrink a small set!");
  free(CurArray);

  // Reduce the number of buckets.
  unsigned Size = size();
  CurArraySize = Size > 16 ? 1 << (Log2_32_Ceil(Size) + 1) : 32;
  NumNonEmpty = NumTombstones = 0;

  // Install the new array.  Clear all the buckets to empty.
  CurArray = (const void**)safe_malloc(sizeof(void*) * CurArraySize);

  memset(CurArray, -1, CurArraySize*sizeof(void*));
}